

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_decompress.c
# Opt level: O1

int read_data_cross_bytes(byte_t *input_buffer,int max_bits_to_read,byte_t *sub_buffer)

{
  bool bVar1;
  int size;
  int iVar2;
  int write_pos;
  long lVar3;
  long lVar4;
  int iVar5;
  
  if (max_bits_to_read < 1) {
    lVar3 = -1;
  }
  else {
    iVar5 = 0;
    do {
      if (last_bit_idx < in_bit_idx) break;
      size = get_available_bits(in_bit_idx);
      if (max_bits_to_read <= size) {
        size = max_bits_to_read;
      }
      iVar2 = bit_pos_in_current_byte(in_bit_idx);
      write_pos = bit_pos_in_current_byte((long)iVar5);
      lVar3 = bit_idx_to_byte_idx((long)iVar5);
      lVar4 = bit_idx_to_byte_idx(in_bit_idx);
      bit_copy(input_buffer[lVar4],sub_buffer + lVar3,iVar2,write_pos,size);
      in_bit_idx = in_bit_idx + size;
      iVar5 = iVar5 + size;
      iVar2 = max_bits_to_read - size;
      bVar1 = size <= max_bits_to_read;
      max_bits_to_read = iVar2;
    } while (iVar2 != 0 && bVar1);
    lVar3 = (long)(iVar5 + -1);
  }
  lVar3 = bit_idx_to_byte_idx(lVar3);
  return (int)lVar3 + 1;
}

Assistant:

int read_data_cross_bytes(const byte_t input_buffer[], int max_bits_to_read, byte_t sub_buffer[]) {
#ifdef _DEBUG
    log_debug("  read_data_cross_bytes", "in_bit_idx=%-8u last_bit_idx=%u max_bits_to_read=%-8d\n",
            in_bit_idx, last_bit_idx, max_bits_to_read);
#endif

    int sub_buffer_bit_idx = 0;
    while(max_bits_to_read > 0) {
        if(in_bit_idx > last_bit_idx) {
#ifdef _DEBUG
            log_debug("  read_data_cross_bytes",
                    "in_bit_idx=%-8u last_bit_idx=%u max_bits_to_read=%-8d (in_bit_idx > last_bit_idx) break\n",
                    in_bit_idx, last_bit_idx, max_bits_to_read);
#endif
            break;
        }

        int in_available_bits = get_available_bits(in_bit_idx);
        int bits_to_copy = in_available_bits > max_bits_to_read ? max_bits_to_read : in_available_bits;

        int read_bit_idx = bit_pos_in_current_byte(in_bit_idx);
        int write_bit_idx = bit_pos_in_current_byte(sub_buffer_bit_idx);
        long sub_byte_idx = bit_idx_to_byte_idx(sub_buffer_bit_idx);

        // copy bits from most significant bit to least significant
        // e.g. from 5th and size 4 -> 5,4,3,2
        long input_byte_idx = bit_idx_to_byte_idx(in_bit_idx);
        bit_copy(input_buffer[input_byte_idx], &sub_buffer[sub_byte_idx], read_bit_idx, write_bit_idx, bits_to_copy);

        in_bit_idx += bits_to_copy;
        sub_buffer_bit_idx += bits_to_copy;
        max_bits_to_read -= bits_to_copy;
    }

    return bit_idx_to_byte_idx(sub_buffer_bit_idx-1) + 1;
}